

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O2

QByteArray * __thiscall
QByteArray::left(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype n)

{
  qsizetype n_00;
  
  if (n < (this->d).size) {
    n_00 = 0;
    if (0 < n) {
      n_00 = n;
    }
    first(__return_storage_ptr__,this,n_00);
  }
  else {
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QByteArray left(qsizetype n) &&
    {
        if (n >= size())
            return std::move(*this);
        return std::move(*this).first(qMax(n, 0));
    }